

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O2

string * anon_unknown.dwarf_9c21::scrape_type_text(xml_node node)

{
  bool bVar1;
  char_t *pcVar2;
  string *in_RDI;
  xml_node in_stack_ffffffffffffff68;
  xml_node local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  xml_node_iterator local_68;
  xml_node_iterator local_58;
  string local_48 [32];
  
  pcVar2 = pugi::xml_node::name(&local_90);
  wire::string::string((string *)&local_88,"apientry");
  bVar1 = std::operator==(pcVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar1) {
    wire::string::string(in_RDI,"GLAPIENTRY");
  }
  else {
    pcVar2 = pugi::xml_node::value(&local_90);
    wire::string::string(in_RDI,pcVar2);
    pugi::xml_node::children(&local_90);
    local_58._wrap._root = (xml_node_struct *)local_88._M_dataplus._M_p;
    local_58._parent._root = (xml_node_struct *)local_88._M_string_length;
    local_68._wrap._root = (xml_node_struct *)local_88.field_2._M_allocated_capacity;
    local_68._parent._root = (xml_node_struct *)local_88.field_2._8_8_;
    while( true ) {
      bVar1 = pugi::xml_node_iterator::operator!=(&local_58,&local_68);
      if (!bVar1) break;
      pugi::xml_node_iterator::operator*(&local_58);
      scrape_type_text(in_stack_ffffffffffffff68);
      wire::string::operator<<(in_RDI,(string *)local_48);
      std::__cxx11::string::~string(local_48);
      pugi::xml_node_iterator::operator++(&local_58);
    }
  }
  return in_RDI;
}

Assistant:

wire::string scrape_type_text(const pugi::xml_node node)
{
  if (node.name() == wire::string("apientry"))
    return "GLAPIENTRY";

  wire::string result = node.value();

  for (const pugi::xml_node child : node.children())
    result += scrape_type_text(child);

  return result;
}